

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  byte bVar2;
  connectdata *conn;
  byte *pbVar3;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  curl_slist *pcVar11;
  long lVar12;
  curl_slist *pcVar13;
  char *pcVar14;
  byte *pbVar15;
  byte *pbVar16;
  curl_slist *pcVar17;
  curl_slist *pcVar18;
  char *pcVar19;
  char *pcVar20;
  uchar *data_00;
  uchar *data_01;
  uchar *key_00;
  byte *pbVar21;
  char *tmp;
  curl_slist *pcVar22;
  char *pcVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  char *local_580;
  uchar *local_578;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  char region [65];
  char provider0 [65];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf signed_headers;
  uchar sha_hash [32];
  dynbuf canonical_headers;
  time_t clock;
  char sha_hex [65];
  char content_sha256_hdr [151];
  char date_hdr_key [72];
  tm tm;
  char key [82];
  char date_full_hdr [90];
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar14 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar23 = (data->state).aptr.user;
  if (pcVar23 == (char *)0x0) {
    pcVar23 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar7 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar7 != (char *)0x0) {
    return CURLE_OK;
  }
  local_578 = "";
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  pcVar7 = (data->set).str[0x4c];
  pcVar10 = "aws:amz";
  if (pcVar7 != (char *)0x0) {
    pcVar10 = pcVar7;
  }
  __isoc99_sscanf(pcVar10,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    local_580 = (char *)0x0;
    Curl_failf(data,"first aws-sigv4 provider can\'t be empty");
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_00604e41:
    local_578 = (uchar *)0x0;
    data_00 = (uchar *)0x0;
    pcVar14 = (char *)0x0;
  }
  else {
    if (provider1[0] == '\0') {
      strcpy(provider1,provider0);
    }
    if (service[0] != '\0') goto LAB_00604b54;
    pcVar7 = strchr(pcVar14,0x2e);
    if (pcVar7 == (char *)0x0) {
      pcVar14 = "aws-sigv4: service missing in parameters and hostname";
LAB_00604ceb:
      local_580 = (char *)0x0;
      Curl_failf(data,pcVar14);
      CVar6 = CURLE_URL_MALFORMAT;
      goto LAB_00604e41;
    }
    uVar24 = (long)pcVar7 - (long)pcVar14;
    if (0x40 < uVar24) {
      pcVar14 = "aws-sigv4: service too long in hostname";
      goto LAB_00604ceb;
    }
    memcpy(service,pcVar14,uVar24);
    service[uVar24] = '\0';
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"aws_sigv4: picked service %s from host",service);
    }
    if (region[0] == '\0') {
      pcVar7 = pcVar7 + 1;
      pcVar10 = strchr(pcVar7,0x2e);
      if (pcVar10 == (char *)0x0) {
        pcVar14 = "aws-sigv4: region missing in parameters and hostname";
      }
      else {
        uVar24 = (long)pcVar10 - (long)pcVar7;
        if (uVar24 < 0x41) {
          memcpy(region,pcVar7,uVar24);
          region[uVar24] = '\0';
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"aws_sigv4: picked region %s from host",region);
          }
          goto LAB_00604b54;
        }
        pcVar14 = "aws-sigv4: region too long in hostname";
      }
      goto LAB_00604ceb;
    }
LAB_00604b54:
    Curl_http_method(data,conn,&method,&httpreq);
    iVar5 = curl_strequal(provider0,"aws");
    if (iVar5 == 0) {
      bVar25 = false;
    }
    else {
      iVar5 = curl_strequal(service,"s3");
      bVar25 = iVar5 != 0;
    }
    iVar5 = curl_msnprintf(key,0x52,"x-%s-content-sha256",provider1);
    pcVar7 = Curl_checkheaders(data,key,(long)iVar5);
    if ((pcVar7 == (char *)0x0) || (pcVar7 = strchr(pcVar7,0x3a), pcVar7 == (char *)0x0)) {
      if (bVar25) {
        bVar25 = true;
        if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
          bVar25 = (data->set).filesize == 0;
        }
        if (httpreq == HTTPREQ_POST) {
          bVar26 = (data->set).postfields != (void *)0x0;
        }
        else {
          bVar26 = false;
        }
        if ((bool)(bVar25 | bVar26)) {
          CVar6 = calc_payload_hash(data,sha_hash,sha_hex);
          if (CVar6 != CURLE_OK) goto LAB_00604e38;
        }
        else {
          builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
        }
        curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
LAB_00604df9:
        pcVar7 = sha_hex;
        sVar8 = strlen(pcVar7);
        goto LAB_00604e09;
      }
      CVar6 = calc_payload_hash(data,sha_hash,sha_hex);
      if (CVar6 == CURLE_OK) goto LAB_00604df9;
LAB_00604e38:
      local_580 = (char *)0x0;
      goto LAB_00604e41;
    }
    do {
      do {
        pcVar10 = pcVar7;
        pcVar7 = pcVar10 + 1;
      } while (*pcVar7 == ' ');
    } while (*pcVar7 == '\t');
    for (sVar8 = strlen(pcVar7); sVar8 != 0; sVar8 = sVar8 - 1) {
      cVar4 = pcVar10[sVar8];
      if ((cVar4 != ' ') && (cVar4 != '\t')) goto LAB_00604e09;
    }
    sVar8 = 0;
LAB_00604e09:
    time(&clock);
    CVar6 = Curl_gmtime(clock,&tm);
    if (CVar6 != CURLE_OK) goto LAB_00604e38;
    sVar9 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (sVar9 == 0) goto LAB_00604e38;
    sVar9 = strlen(provider1);
    Curl_strntolower(provider1,provider1,sVar9);
    cVar4 = Curl_raw_toupper(provider1[0]);
    provider1[0] = cVar4;
    curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
    Curl_strntolower(provider1,provider1,1);
    curl_msnprintf(date_full_hdr,0x5a,"x-%s-date:%s",provider1,timestamp);
    pcVar10 = Curl_checkheaders(data,"Host",4);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = (data->state).aptr.host;
      if (pcVar10 == (char *)0x0) {
        sVar9 = strlen(pcVar14);
        CVar6 = CURLE_URL_MALFORMAT;
        if (sVar9 < 0x100) {
          curl_msnprintf(key,0x105,"host:%s",pcVar14);
          goto LAB_0060526a;
        }
      }
      else {
        sVar9 = strlen(pcVar10);
        CVar6 = CURLE_URL_MALFORMAT;
        if (sVar9 < 0x106) {
          strcpy(key,pcVar10);
          sVar9 = strcspn(key,"\n\r");
          key[sVar9] = '\0';
LAB_0060526a:
          pcVar13 = curl_slist_append((curl_slist *)0x0,key);
          if (pcVar13 != (curl_slist *)0x0) goto LAB_00604f7e;
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
      }
      local_580 = (char *)0x0;
      pcVar13 = (curl_slist *)0x0;
LAB_00605516:
      curl_slist_free_all(pcVar13);
      goto LAB_00604e41;
    }
    pcVar13 = (curl_slist *)0x0;
LAB_00604f7e:
    pcVar11 = pcVar13;
    if ((content_sha256_hdr[0] != '\0') &&
       (pcVar11 = curl_slist_append(pcVar13,content_sha256_hdr), pcVar11 == (curl_slist *)0x0)) {
      CVar6 = CURLE_OUT_OF_MEMORY;
      local_580 = (char *)0x0;
      goto LAB_00605516;
    }
    pcVar13 = pcVar11;
    for (pcVar22 = (data->set).headers; pcVar11 = pcVar13, pcVar17 = pcVar13,
        pcVar22 != (curl_slist *)0x0; pcVar22 = pcVar22->next) {
      pcVar14 = pcVar22->data;
      pcVar10 = strchr(pcVar14,0x3a);
      if (((pcVar10 != (char *)0x0) || (pcVar10 = strchr(pcVar14,0x3b), pcVar10 != (char *)0x0)) &&
         ((*pcVar10 != ':' || (pcVar10[1] != '\0')))) {
        lVar12 = 0;
        while (((cVar4 = pcVar10[lVar12 + 1], cVar4 == '\t' || (cVar4 == ' ')) ||
               ((byte)(cVar4 - 10U) < 4))) {
          lVar12 = lVar12 + 1;
        }
        if ((lVar12 == 0) || (cVar4 != '\0')) {
          pcVar14 = (*Curl_cstrdup)(pcVar14);
          if (pcVar14 == (char *)0x0) {
            local_580 = (char *)0x0;
            goto LAB_00605511;
          }
          pcVar14[(long)pcVar10 - (long)pcVar22->data] = ':';
          pcVar13 = Curl_slist_append_nodup(pcVar13,pcVar14);
          if (pcVar13 == (curl_slist *)0x0) {
            (*Curl_cfree)(pcVar14);
            local_580 = (char *)0x0;
            goto LAB_00605511;
          }
        }
      }
    }
    for (; pcVar11 != (curl_slist *)0x0; pcVar11 = pcVar11->next) {
      pcVar14 = pcVar11->data;
      sVar9 = strcspn(pcVar14,":");
      Curl_strntolower(pcVar14,pcVar14,sVar9);
      if (pcVar11->data[sVar9] != '\0') {
        pcVar14 = pcVar11->data + sVar9 + 1;
        for (pcVar10 = pcVar14; (cVar4 = *pcVar10, cVar4 == '\t' || (cVar4 == ' '));
            pcVar10 = pcVar10 + 1) {
        }
        while (cVar4 != '\0') {
          iVar5 = 0;
          pcVar19 = pcVar10;
          while ((pcVar10 = pcVar19 + 1, cVar4 == ' ' || (cVar4 == '\t'))) {
            iVar5 = iVar5 + -1;
            pcVar19 = pcVar10;
            cVar4 = *pcVar10;
          }
          if (iVar5 != 0) {
            if (cVar4 == '\0') break;
            cVar4 = ' ';
            pcVar10 = pcVar19;
          }
          *pcVar14 = cVar4;
          pcVar14 = pcVar14 + 1;
          cVar4 = *pcVar10;
        }
        *pcVar14 = '\0';
      }
    }
    sVar9 = strlen(date_hdr_key);
    pcVar14 = Curl_checkheaders(data,date_hdr_key,sVar9);
    if ((pcVar14 == (char *)0x0) &&
       (pcVar14 = Curl_checkheaders(data,"Date",4), pcVar14 == (char *)0x0)) {
      pcVar17 = curl_slist_append(pcVar13,date_full_hdr);
      if (pcVar17 == (curl_slist *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
        local_580 = (char *)0x0;
        goto LAB_00605516;
      }
      local_580 = curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
LAB_0060537f:
      pcVar13 = pcVar17->next;
      do {
        if (pcVar13 == (curl_slist *)0x0) break;
        bVar25 = false;
        pcVar11 = pcVar13;
        pcVar14 = pcVar17->data;
        pcVar22 = pcVar17;
        do {
          pcVar18 = pcVar11;
          pcVar10 = pcVar18->data;
          iVar5 = strcmp(pcVar14,pcVar10);
          if (0 < iVar5) {
            pcVar22->data = pcVar10;
            pcVar18->data = pcVar14;
            bVar25 = true;
            pcVar10 = pcVar14;
          }
          pcVar11 = pcVar18->next;
          pcVar14 = pcVar10;
          pcVar22 = pcVar18;
        } while (pcVar18->next != (curl_slist *)0x0);
      } while (bVar25);
      pcVar13 = pcVar17;
      do {
        CVar6 = Curl_dyn_add(&canonical_headers,pcVar13->data);
        if ((CVar6 != CURLE_OK) ||
           (CVar6 = Curl_dyn_add(&canonical_headers,"\n"), CVar6 != CURLE_OK)) goto LAB_00605511;
        pcVar14 = strchr(pcVar13->data,0x3a);
        if (pcVar14 != (char *)0x0) {
          *pcVar14 = '\0';
        }
        if (((pcVar13 != pcVar17) && (CVar6 = Curl_dyn_add(&signed_headers,";"), CVar6 != CURLE_OK))
           || (CVar6 = Curl_dyn_add(&signed_headers,pcVar13->data), CVar6 != CURLE_OK))
        goto LAB_00605511;
        pcVar13 = pcVar13->next;
        pcVar11 = pcVar17;
      } while (pcVar13 != (curl_slist *)0x0);
    }
    else {
      pbVar15 = (byte *)strchr(pcVar14,0x3a);
      if (pbVar15 == (byte *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
        local_580 = (char *)0x0;
        goto LAB_00605516;
      }
      pbVar16 = pbVar15 + 0x11;
      while( true ) {
        pbVar21 = pbVar15 + 1;
        bVar2 = *pbVar21;
        if ((bVar2 != 9) && (pbVar3 = pbVar21, bVar2 != 0x20)) break;
        pbVar16 = pbVar16 + 1;
        pbVar15 = pbVar21;
      }
      while ((bVar2 != 0 && (((byte)(bVar2 - 0x30) < 10 || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a))))
            ) {
        bVar2 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
      }
      if (pbVar3 == pbVar16) {
        timestamp._0_8_ = *(undefined8 *)pbVar21;
        timestamp._8_8_ = *(undefined8 *)(pbVar15 + 9);
        timestamp[0x10] = '\0';
      }
      else {
        timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
      }
      local_580 = (char *)0x0;
      pcVar11 = (curl_slist *)0x0;
      if (pcVar13 != (curl_slist *)0x0) goto LAB_0060537f;
    }
    curl_slist_free_all(pcVar11);
    if (content_sha256_hdr[0] != '\0') {
      sVar9 = strlen(content_sha256_hdr);
      (content_sha256_hdr + sVar9)[0] = '\r';
      (content_sha256_hdr + sVar9)[1] = '\n';
      content_sha256_hdr[sVar9 + 2] = '\0';
    }
    key[0] = timestamp[0];
    key[1] = timestamp[1];
    key[2] = timestamp[2];
    key[3] = timestamp[3];
    key[4] = timestamp[4];
    key[5] = timestamp[5];
    key[6] = timestamp[6];
    key[7] = timestamp[7];
    key[8] = '\0';
    CVar6 = canon_query(data,(data->state).up.query,&canonical_query);
    pcVar14 = method;
    if (CVar6 != CURLE_OK) {
      local_578 = (uchar *)0x0;
      data_00 = (uchar *)0x0;
      pcVar14 = (char *)0x0;
      data_01 = (uchar *)0x0;
      key_00 = (uchar *)0x0;
      goto LAB_00604e56;
    }
    pcVar10 = (data->state).up.path;
    pcVar19 = Curl_dyn_ptr(&canonical_query);
    if (pcVar19 != (char *)0x0) {
      local_578 = (uchar *)Curl_dyn_ptr(&canonical_query);
    }
    pcVar19 = Curl_dyn_ptr(&canonical_headers);
    pcVar20 = Curl_dyn_ptr(&signed_headers);
    local_578 = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar14,pcVar10,local_578,pcVar19,
                                       pcVar20,sVar8,pcVar7);
    if (local_578 != (uchar *)0x0) {
      sVar8 = strlen(provider0);
      Curl_strntolower(provider0,provider0,sVar8);
      data_00 = (uchar *)curl_maprintf("%s4_request",provider0);
      if (data_00 == (uchar *)0x0) {
        data_00 = (uchar *)0x0;
      }
      else {
        pcVar14 = curl_maprintf("%s/%s/%s/%s",key,region,service,data_00);
        if (pcVar14 != (char *)0x0) {
          sVar8 = strlen((char *)local_578);
          CVar6 = Curl_sha256it(sha_hash,local_578,sVar8);
          if (CVar6 != CURLE_OK) {
            data_01 = (uchar *)0x0;
            key_00 = (uchar *)0x0;
            CVar6 = CURLE_OUT_OF_MEMORY;
            goto LAB_00604e56;
          }
          Curl_hexencode(sha_hash,0x20,(uchar *)sha_hex,0x41);
          sVar8 = strlen(provider0);
          Curl_strntoupper(provider0,provider0,sVar8);
          data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,pcVar14
                                           ,sha_hex);
          if (data_01 != (uchar *)0x0) {
            pcVar7 = (data->state).aptr.passwd;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "";
            }
            key_00 = (uchar *)curl_maprintf("%s4%s",provider0,pcVar7);
            if (key_00 == (uchar *)0x0) {
              key_00 = (uchar *)0x0;
              CVar6 = CURLE_OUT_OF_MEMORY;
            }
            else {
              sVar8 = strlen((char *)key_00);
              sVar9 = strlen(key);
              CVar6 = Curl_hmacit(Curl_HMAC_SHA256,key_00,sVar8,(uchar *)key,sVar9,sign0);
              if (CVar6 == CURLE_OK) {
                sVar8 = strlen(region);
                CVar6 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar8,sign1);
                if (CVar6 == CURLE_OK) {
                  sVar8 = strlen(service);
                  CVar6 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar8,sign0);
                  if (CVar6 == CURLE_OK) {
                    sVar8 = strlen((char *)data_00);
                    CVar6 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,data_00,sVar8,sign1);
                    if (CVar6 == CURLE_OK) {
                      sVar8 = strlen((char *)data_01);
                      CVar6 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_01,sVar8,sign0);
                      if (CVar6 == CURLE_OK) {
                        Curl_hexencode(sign0,0x20,(uchar *)sha_hex,0x41);
                        pcVar10 = Curl_dyn_ptr(&signed_headers);
                        pcVar7 = "";
                        if (local_580 != (char *)0x0) {
                          pcVar7 = local_580;
                        }
                        pcVar23 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                                ,provider0,pcVar23,pcVar14,pcVar10,sha_hex,pcVar7,
                                                content_sha256_hdr);
                        if (pcVar23 != (char *)0x0) {
                          (*Curl_cfree)((data->state).aptr.userpwd);
                          (data->state).aptr.userpwd = pcVar23;
                          puVar1 = &(data->state).authhost.field_0x18;
                          *puVar1 = *puVar1 | 1;
                        }
                        CVar6 = CURLE_OK;
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00604e56;
          }
          CVar6 = CURLE_OUT_OF_MEMORY;
          goto LAB_00604e53;
        }
      }
      data_01 = (uchar *)0x0;
      pcVar14 = (char *)0x0;
      key_00 = (uchar *)0x0;
      CVar6 = CURLE_OUT_OF_MEMORY;
      goto LAB_00604e56;
    }
    local_578 = (uchar *)0x0;
    pcVar14 = (char *)0x0;
    data_00 = (uchar *)0x0;
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
LAB_00604e53:
  data_01 = (uchar *)0x0;
  key_00 = (uchar *)0x0;
LAB_00604e56:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(local_578);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key_00);
  (*Curl_cfree)(local_580);
  return CVar6;
LAB_00605511:
  CVar6 = CURLE_OUT_OF_MEMORY;
  pcVar13 = pcVar17;
  goto LAB_00605516;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = false;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider can't be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    curl_maprintf("%s\n" /* HTTPRequestMethod */
                  "%s\n" /* CanonicalURI */
                  "%s\n" /* CanonicalQueryString */
                  "%s\n" /* CanonicalHeaders */
                  "%s\n" /* SignedHeaders */
                  "%.*s",  /* HashedRequestPayload in hex */
                  method,
                  data->state.up.path,
                  Curl_dyn_ptr(&canonical_query) ?
                  Curl_dyn_ptr(&canonical_query) : "",
                  Curl_dyn_ptr(&canonical_headers),
                  Curl_dyn_ptr(&signed_headers),
                  (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               /*
                                * date_header is added here, only if it wasn't
                                * user-specified (using CURLOPT_HTTPHEADER).
                                * date_header includes \r\n
                                */
                               "%s"
                               "%s", /* optional sha256 header includes \r\n */
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header ? date_header : "",
                               content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}